

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O1

void * duckdb_je_hook_install(tsdn_t *tsdn,hooks_t *to_install)

{
  seq_hooks_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong in_R8;
  size_t i;
  long lVar7;
  ulong uVar8;
  size_t i_1;
  seq_hooks_t *unaff_R15;
  size_t buf [5];
  undefined4 local_50;
  undefined3 uStack_4c;
  hook_alloc local_48;
  hook_dalloc p_Stack_40;
  hook_expand local_38;
  void *pvStack_30;
  undefined8 local_28;
  
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&hooks_mu);
    hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  hooks_mu.field_0.field_0.prof_data.n_lock_ops = hooks_mu.field_0.field_0.prof_data.n_lock_ops + 1;
  if (hooks_mu.field_0.field_0.prof_data.prev_owner != tsdn) {
    hooks_mu.field_0.witness.link.qre_prev =
         (witness_t *)(hooks_mu.field_0.field_0.prof_data.n_owner_switches + 1);
    hooks_mu.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  lVar5 = 0x1bf5d38;
  lVar6 = 0;
  do {
    psVar1 = hooks + lVar6;
    uVar2 = hooks[lVar6].seq.repr;
    if ((uVar2 & 1) == 0) {
      lVar7 = 0;
      do {
        (&local_48)[lVar7] = *(hook_alloc *)(lVar5 + lVar7 * 8);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      uVar8 = in_R8 & 0xffffffff;
      if (uVar2 == (psVar1->seq).repr) {
        uVar8 = local_28 & 0xff;
        uStack_4c = (undefined3)(local_28 >> 0x28);
        local_50 = local_28._1_4_;
      }
    }
    else {
      uVar8 = in_R8 & 0xffffffff;
    }
    in_R8 = uVar8;
    if ((uVar8 & 1) == 0) {
      local_48 = to_install->alloc_hook;
      p_Stack_40 = to_install->dalloc_hook;
      local_38 = to_install->expand_hook;
      pvStack_30 = to_install->extra;
      local_28 = CONCAT35(uStack_4c,CONCAT41(local_50,1));
      sVar3 = (psVar1->seq).repr;
      (psVar1->seq).repr = sVar3 + 1;
      lVar7 = 0;
      do {
        *(hook_alloc *)(lVar5 + lVar7 * 8) = (&local_48)[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      (psVar1->seq).repr = sVar3 + 2;
      nhooks.repr = nhooks.repr + 1;
      in_R8 = 1;
      unaff_R15 = psVar1;
    }
    if ((uVar8 & 1) == 0) goto LAB_01198007;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x30;
  } while (lVar6 != 4);
  unaff_R15 = (seq_hooks_t *)0x0;
LAB_01198007:
  if (unaff_R15 != (seq_hooks_t *)0x0) {
    duckdb_je_tsd_global_slow_inc(tsdn);
  }
  hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  return unaff_R15;
}

Assistant:

void *
hook_install(tsdn_t *tsdn, hooks_t *to_install) {
	malloc_mutex_lock(tsdn, &hooks_mu);
	void *ret = hook_install_locked(to_install);
	if (ret != NULL) {
		tsd_global_slow_inc(tsdn);
	}
	malloc_mutex_unlock(tsdn, &hooks_mu);
	return ret;
}